

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_27d855::mock_string_stream_traits::mock_string_stream_traits
          (mock_string_stream_traits *this)

{
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::FunctionMocker(&this->gmock03_open_44);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&this->gmock01_close_45);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&this->gmock01_clear_46);
  return;
}

Assistant:

mock_string_stream_traits () {}